

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::RadixScatterListVector
               (Vector *v,UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t prefix_len,
               idx_t width,idx_t offset)

{
  data_ptr_t *ppdVar1;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  uint64_t uVar4;
  bool bVar5;
  list_entry_t *plVar6;
  Vector *this;
  idx_t count;
  SelectionVector *pSVar7;
  byte *pbVar8;
  idx_t i;
  idx_t iVar9;
  byte *pbVar10;
  idx_t iVar12;
  size_t sVar13;
  data_ptr_t pdVar11;
  
  plVar6 = ListVector::GetData(v);
  this = ListVector::GetEntry(v);
  count = ListVector::GetListSize(v);
  Vector::Flatten(this,count);
  if (has_null) {
    sVar13 = width - 2;
    for (iVar9 = 0; iVar9 != add_count; iVar9 = iVar9 + 1) {
      iVar12 = iVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar9];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar2[iVar12];
      }
      iVar12 = iVar12 + offset;
      ppdVar1 = key_locations + iVar9;
      pdVar11 = *ppdVar1;
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar12);
      pdVar3 = *ppdVar1;
      *ppdVar1 = pdVar3 + 1;
      if (bVar5) {
        *pdVar3 = nulls_first;
        pdVar3 = *ppdVar1;
        uVar4 = plVar6[iVar12].length;
        *ppdVar1 = pdVar3 + 1;
        if (uVar4 == 0) {
          *pdVar3 = '\0';
          switchD_014c69ad::default(*ppdVar1,0,sVar13);
          *ppdVar1 = *ppdVar1 + sVar13;
        }
        else {
          *pdVar3 = '\x01';
          pSVar7 = FlatVector::IncrementalSelectionVector();
          RowOperations::RadixScatter
                    (this,count,pSVar7,1,ppdVar1,false,true,false,prefix_len,sVar13,
                     plVar6[iVar12].offset);
        }
        if (desc) {
          pbVar8 = pdVar11 + width;
          while( true ) {
            pbVar10 = pdVar11 + 1;
            *ppdVar1 = pbVar10;
            if (pbVar8 <= pbVar10) break;
            *pbVar10 = ~*pbVar10;
            pdVar11 = *ppdVar1;
          }
        }
      }
      else {
        *pdVar3 = !nulls_first;
        switchD_014c69ad::default(*ppdVar1,0,width - 1);
        *ppdVar1 = *ppdVar1 + (width - 1);
      }
    }
  }
  else {
    sVar13 = width - 1;
    for (iVar9 = 0; iVar9 != add_count; iVar9 = iVar9 + 1) {
      iVar12 = iVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar9];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar2[iVar12];
      }
      ppdVar1 = key_locations + iVar9;
      pbVar8 = *ppdVar1;
      uVar4 = plVar6[offset + iVar12].length;
      *ppdVar1 = pbVar8 + 1;
      if (uVar4 == 0) {
        *pbVar8 = 0;
        switchD_014c69ad::default(*ppdVar1,0,sVar13);
        *ppdVar1 = *ppdVar1 + sVar13;
      }
      else {
        *pbVar8 = 1;
        pSVar7 = FlatVector::IncrementalSelectionVector();
        RowOperations::RadixScatter
                  (this,count,pSVar7,1,ppdVar1,false,true,false,prefix_len,sVar13,
                   plVar6[offset + iVar12].offset);
      }
      if (desc) {
        pbVar10 = pbVar8 + width;
        while (*ppdVar1 = pbVar8, pbVar8 < pbVar10) {
          *pbVar8 = ~*pbVar8;
          pbVar8 = *ppdVar1 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void RadixScatterListVector(Vector &v, UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                            data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                            const idx_t prefix_len, const idx_t width, const idx_t offset) {
	auto list_data = ListVector::GetData(v);
	auto &child_vector = ListVector::GetEntry(v);
	auto list_size = ListVector::GetListSize(v);
	child_vector.Flatten(list_size);

	// serialize null values
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				*key_location++ = valid;
				auto &list_entry = list_data[source_idx];
				if (list_entry.length > 0) {
					// denote that the list is not empty with a 1
					*key_location++ = 1;
					RowOperations::RadixScatter(child_vector, list_size, *FlatVector::IncrementalSelectionVector(), 1,
					                            key_locations + i, false, true, false, prefix_len, width - 2,
					                            list_entry.offset);
				} else {
					// denote that the list is empty with a 0
					*key_location++ = 0;
					// mark rest of bits as empty
					memset(key_location, '\0', width - 2);
					key_location += width - 2;
				}
				// invert bits if desc
				if (desc) {
					// skip over validity byte, handled by nulls first/last
					for (key_location = key_location_start + 1; key_location < key_location_start + width;
					     key_location++) {
						*key_location = ~*key_location;
					}
				}
			} else {
				*key_location++ = invalid;
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			auto &list_entry = list_data[source_idx];
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;
			if (list_entry.length > 0) {
				// denote that the list is not empty with a 1
				*key_location++ = 1;
				RowOperations::RadixScatter(child_vector, list_size, *FlatVector::IncrementalSelectionVector(), 1,
				                            key_locations + i, false, true, false, prefix_len, width - 1,
				                            list_entry.offset);
			} else {
				// denote that the list is empty with a 0
				*key_location++ = 0;
				// mark rest of bits as empty
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			// invert bits if desc
			if (desc) {
				for (key_location = key_location_start; key_location < key_location_start + width; key_location++) {
					*key_location = ~*key_location;
				}
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	}
}